

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int __thiscall
duckdb_fmt::v6::internal::
arg_map<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
::init(arg_map<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
       *this,EVP_PKEY_CTX *ctx)

{
  undefined8 *puVar1;
  value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  val;
  value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  val_00;
  int in_EAX;
  uint uVar2;
  entry *peVar3;
  ulong uVar4;
  entry *extraout_RAX;
  long lVar5;
  undefined8 unaff_RBX;
  undefined8 unaff_R12;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  
  if (this->map_ != (entry *)0x0) {
    return in_EAX;
  }
  uVar6 = *(ulong *)ctx;
  uVar4 = 0xc;
  if ((long)uVar6 < 0) {
    uVar4 = uVar6;
  }
  uVar8 = (uVar4 & 0xffffffff) * 0x30;
  peVar3 = (entry *)operator_new__(uVar8);
  if ((int)uVar4 != 0) {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)&(peVar3->arg).type_ + lVar5) = 0;
      *(undefined4 *)((long)&(peVar3->arg).value_.field_0 + lVar5) = 0;
      puVar1 = (undefined8 *)((long)&(peVar3->name).data_ + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 0x30;
    } while (uVar8 - lVar5 != 0);
  }
  this->map_ = peVar3;
  if (-1 < (long)uVar6) {
    bVar7 = 0;
    do {
      uVar4 = uVar6 >> (bVar7 & 0x3f);
      uVar2 = (uint)uVar4 & 0x1f;
      if (uVar2 == 1) {
        val.field_0.string.size = unaff_R12;
        val.field_0.long_long_value = unaff_RBX;
        push_back(this,val);
        uVar6 = *(ulong *)ctx;
      }
      else if ((uVar4 & 0x1f) == 0) {
        return uVar2;
      }
      bVar7 = bVar7 + 5;
    } while( true );
  }
  lVar5 = 0;
  uVar4 = 0;
  if (0 < (int)uVar6) {
    uVar4 = uVar6 & 0xffffffff;
  }
  for (; uVar4 * 0x20 != lVar5; lVar5 = lVar5 + 0x20) {
    peVar3 = *(entry **)(ctx + 8);
    if (*(int *)((long)&(peVar3->arg).value_.field_0 + lVar5) == 1) {
      val_00.field_0.string.size = unaff_R12;
      val_00.field_0.long_long_value = unaff_RBX;
      push_back(this,val_00);
      peVar3 = extraout_RAX;
    }
  }
  return (int)peVar3;
}

Assistant:

void arg_map<Context>::init(const basic_format_args<Context>& args) {
  if (map_) return;
  map_ = new entry[internal::to_unsigned(args.max_size())];
  if (args.is_packed()) {
    for (int i = 0;; ++i) {
      internal::type arg_type = args.type(i);
      if (arg_type == internal::none_type) return;
      if (arg_type == internal::named_arg_type) push_back(args.values_[i]);
    }
  }
  for (int i = 0, n = args.max_size(); i < n; ++i) {
    auto type = args.args_[i].type_;
    if (type == internal::named_arg_type) push_back(args.args_[i].value_);
  }
}